

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-async-null-cb.c
# Opt level: O2

int run_test_async_null_cb(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uStack_10;
  
  async_handle.queue[1]._0_4_ = 0xffffffff;
  async_handle.queue[1]._4_4_ = 0xffffffff;
  async_handle.pending = -1;
  async_handle._124_4_ = 0xffffffff;
  async_handle.async_cb._0_4_ = 0xffffffff;
  async_handle.async_cb._4_4_ = 0xffffffff;
  async_handle.queue[0]._0_4_ = 0xffffffff;
  async_handle.queue[0]._4_4_ = 0xffffffff;
  async_handle.next_closing._0_4_ = 0xffffffff;
  async_handle.next_closing._4_4_ = 0xffffffff;
  async_handle.flags = 0xffffffff;
  async_handle._92_4_ = 0xffffffff;
  async_handle.u._16_4_ = 0xffffffff;
  async_handle.u._20_4_ = 0xffffffff;
  async_handle.u._24_4_ = 0xffffffff;
  async_handle.u._28_4_ = 0xffffffff;
  async_handle.u.fd = -1;
  async_handle.u._4_4_ = 0xffffffff;
  async_handle.u._8_4_ = 0xffffffff;
  async_handle.u._12_4_ = 0xffffffff;
  async_handle.handle_queue[0]._0_4_ = 0xffffffff;
  async_handle.handle_queue[0]._4_4_ = 0xffffffff;
  async_handle.handle_queue[1]._0_4_ = 0xffffffff;
  async_handle.handle_queue[1]._4_4_ = 0xffffffff;
  async_handle.type = ~UV_UNKNOWN_HANDLE;
  async_handle._20_4_ = 0xffffffff;
  async_handle.close_cb._0_4_ = 0xffffffff;
  async_handle.close_cb._4_4_ = 0xffffffff;
  async_handle.data._0_4_ = 0xffffffff;
  async_handle.data._4_4_ = 0xffffffff;
  async_handle.loop._0_4_ = 0xffffffff;
  async_handle.loop._4_4_ = 0xffffffff;
  uVar2 = uv_default_loop();
  iVar1 = uv_async_init(uVar2,&async_handle,0);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_check_init(uVar2,&check_handle);
    if (iVar1 == 0) {
      iVar1 = uv_check_start(&check_handle,check_cb);
      if (iVar1 == 0) {
        iVar1 = uv_thread_create(&thread,thread_cb,0);
        if (iVar1 == 0) {
          uVar2 = uv_default_loop();
          iVar1 = uv_run(uVar2,0);
          if (iVar1 == 0) {
            iVar1 = uv_thread_join(&thread);
            if (iVar1 == 0) {
              if (check_cb_called == 1) {
                uVar2 = uv_default_loop();
                uv_walk(uVar2,close_walk_cb,0);
                uv_run(uVar2,0);
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                uStack_10 = 0x3e;
              }
              else {
                pcVar3 = "1 == check_cb_called";
                uStack_10 = 0x3d;
              }
            }
            else {
              pcVar3 = "0 == uv_thread_join(&thread)";
              uStack_10 = 0x3c;
            }
          }
          else {
            pcVar3 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
            uStack_10 = 0x3b;
          }
        }
        else {
          pcVar3 = "0 == uv_thread_create(&thread, thread_cb, NULL)";
          uStack_10 = 0x3a;
        }
      }
      else {
        pcVar3 = "0 == uv_check_start(&check_handle, check_cb)";
        uStack_10 = 0x39;
      }
    }
    else {
      pcVar3 = "0 == uv_check_init(uv_default_loop(), &check_handle)";
      uStack_10 = 0x38;
    }
  }
  else {
    pcVar3 = "0 == uv_async_init(uv_default_loop(), &async_handle, NULL)";
    uStack_10 = 0x37;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-async-null-cb.c"
          ,uStack_10,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(async_null_cb) {
  /*
   * Fill async_handle with garbage values.
   * uv_async_init() should properly initialize struct fields regardless of
   * initial values.
   * This is added to verify paddings between fields do not affect behavior.
   */
  memset(&async_handle, 0xff, sizeof(async_handle));

  ASSERT(0 == uv_async_init(uv_default_loop(), &async_handle, NULL));
  ASSERT(0 == uv_check_init(uv_default_loop(), &check_handle));
  ASSERT(0 == uv_check_start(&check_handle, check_cb));
  ASSERT(0 == uv_thread_create(&thread, thread_cb, NULL));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == uv_thread_join(&thread));
  ASSERT(1 == check_cb_called);
  MAKE_VALGRIND_HAPPY();
  return 0;
}